

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O1

Reals __thiscall
Omega_h::measure_ents_real_tmpl<3,1>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *coords)

{
  int *piVar1;
  ulong *puVar2;
  LOs *pLVar3;
  undefined8 uVar4;
  undefined8 this_00;
  long *plVar5;
  ulong *puVar6;
  void *extraout_RDX;
  ulong uVar7;
  Alloc *pAVar8;
  LO size_in;
  size_t sVar9;
  bool bVar10;
  Reals RVar11;
  ScopedTimer omega_h_scoped_function_timer;
  Write<double> sizes;
  RealSimplexSizes measurer;
  type f;
  LOs ev2v;
  ScopedTimer local_e9;
  Write<double> local_e8;
  undefined1 local_d8 [48];
  type local_a8;
  Write<double> local_68;
  undefined1 local_58 [40];
  
  local_58._0_8_ = (Alloc *)(local_58 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_shape.cpp"
             ,"");
  plVar5 = (long *)std::__cxx11::string::append(local_58);
  puVar2 = (ulong *)(local_d8 + 0x20);
  puVar6 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar6) {
    local_d8._32_8_ = *puVar6;
    local_d8._40_8_ = plVar5[3];
    local_d8._16_8_ = puVar2;
  }
  else {
    local_d8._32_8_ = *puVar6;
    local_d8._16_8_ = (ulong *)*plVar5;
  }
  local_d8._24_8_ = plVar5[1];
  *plVar5 = (long)puVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_e8.shared_alloc_.alloc = (Alloc *)local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,'\x02');
  *(undefined2 *)&(local_e8.shared_alloc_.alloc)->size = 0x3335;
  uVar7 = 0xf;
  if ((ulong *)local_d8._16_8_ != puVar2) {
    uVar7 = local_d8._32_8_;
  }
  if (uVar7 < (ulong)((long)local_e8.shared_alloc_.direct_ptr + local_d8._24_8_)) {
    uVar7 = 0xf;
    if (local_e8.shared_alloc_.alloc != (Alloc *)local_d8) {
      uVar7 = local_d8._0_8_;
    }
    if ((ulong)((long)local_e8.shared_alloc_.direct_ptr + local_d8._24_8_) <= uVar7) {
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,local_d8._16_8_)
      ;
      goto LAB_003c18c5;
    }
  }
  plVar5 = (long *)std::__cxx11::string::_M_append
                             (local_d8 + 0x10,(ulong)local_e8.shared_alloc_.alloc);
LAB_003c18c5:
  local_a8.a2e.write_.shared_alloc_.alloc = (Alloc *)&local_a8.ev2v;
  pAVar8 = (Alloc *)(plVar5 + 2);
  if ((Alloc *)*plVar5 == pAVar8) {
    local_a8.ev2v.write_.shared_alloc_.alloc = (Alloc *)pAVar8->size;
    local_a8.ev2v.write_.shared_alloc_.direct_ptr = (void *)plVar5[3];
  }
  else {
    local_a8.ev2v.write_.shared_alloc_.alloc = (Alloc *)pAVar8->size;
    local_a8.a2e.write_.shared_alloc_.alloc = (Alloc *)*plVar5;
  }
  local_a8.a2e.write_.shared_alloc_.direct_ptr = (void *)plVar5[1];
  *plVar5 = (long)pAVar8;
  plVar5[1] = 0;
  *(undefined1 *)&pAVar8->size = 0;
  local_58._32_8_ = this;
  begin_code("measure_ents_real_tmpl",(char *)local_a8.a2e.write_.shared_alloc_.alloc);
  pLVar3 = &local_a8.ev2v;
  if (local_a8.a2e.write_.shared_alloc_.alloc != (Alloc *)pLVar3) {
    operator_delete(local_a8.a2e.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_a8.ev2v.write_.shared_alloc_.alloc)->size + 1));
  }
  if (local_e8.shared_alloc_.alloc != (Alloc *)local_d8) {
    operator_delete(local_e8.shared_alloc_.alloc,local_d8._0_8_ + 1);
  }
  if ((ulong *)local_d8._16_8_ != puVar2) {
    operator_delete((void *)local_d8._16_8_,local_d8._32_8_ + 1);
  }
  if ((Alloc *)local_58._0_8_ != (Alloc *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_,(ulong)((long)(_func_int ***)local_58._16_8_ + 1));
  }
  pAVar8 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar8 & 7) == 0 && pAVar8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar8 = (Alloc *)(pAVar8->size * 8 + 1);
    }
    else {
      pAVar8->use_count = pAVar8->use_count + 1;
    }
  }
  local_d8._24_8_ = (coords->write_).shared_alloc_.direct_ptr;
  bVar10 = ((ulong)pAVar8 & 7) == 0;
  local_d8._16_8_ = pAVar8;
  if (bVar10 && pAVar8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8._16_8_ = (Alloc *)(pAVar8->size * 8 + 1);
    }
    else {
      pAVar8->use_count = pAVar8->use_count + 1;
    }
  }
  if (bVar10 && pAVar8 != (Alloc *)0x0) {
    piVar1 = &pAVar8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar8);
      operator_delete(pAVar8,0x48);
    }
  }
  Mesh::ask_verts_of((Mesh *)local_58,(Int)mesh);
  pAVar8 = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)pAVar8 & 1) == 0) {
    sVar9 = pAVar8->size;
  }
  else {
    sVar9 = (ulong)pAVar8 >> 3;
  }
  local_a8.a2e.write_.shared_alloc_.alloc = (Alloc *)pLVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  size_in = (LO)(sVar9 >> 2);
  Write<double>::Write(&local_e8,size_in,(string *)&local_a8);
  if (local_a8.a2e.write_.shared_alloc_.alloc != (Alloc *)pLVar3) {
    operator_delete(local_a8.a2e.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_a8.ev2v.write_.shared_alloc_.alloc)->size + 1));
  }
  this_00 = local_58._32_8_;
  local_a8.a2e.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)local_a8.a2e.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.a2e.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.a2e.write_.shared_alloc_.alloc =
           (Alloc *)((local_a8.a2e.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a8.a2e.write_.shared_alloc_.alloc)->use_count =
           (local_a8.a2e.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.a2e.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
  local_a8.ev2v.write_.shared_alloc_.alloc = (Alloc *)local_58._0_8_;
  if ((local_58._0_8_ & 7) == 0 && (Alloc *)local_58._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.ev2v.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_58._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_58._0_8_ + 0x30) = *(int *)(local_58._0_8_ + 0x30) + 1;
    }
  }
  local_a8.ev2v.write_.shared_alloc_.direct_ptr = (void *)local_58._8_8_;
  local_a8.sizes.shared_alloc_.alloc = local_e8.shared_alloc_.alloc;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_a8.sizes.shared_alloc_.alloc = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.sizes.shared_alloc_.direct_ptr = local_e8.shared_alloc_.direct_ptr;
  local_a8.measurer.coords.write_.shared_alloc_.alloc = (Alloc *)local_d8._16_8_;
  if ((local_d8._16_8_ & 7) == 0 && (Alloc *)local_d8._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.measurer.coords.write_.shared_alloc_.alloc =
           (Alloc *)(*(size_t *)local_d8._16_8_ * 8 + 1);
    }
    else {
      *(int *)(local_d8._16_8_ + 0x30) = *(int *)(local_d8._16_8_ + 0x30) + 1;
    }
  }
  local_a8.measurer.coords.write_.shared_alloc_.direct_ptr = (void *)local_d8._24_8_;
  parallel_for<Omega_h::measure_ents_real_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (size_in,&local_a8,"measure_ents_real");
  local_68.shared_alloc_.alloc = local_e8.shared_alloc_.alloc;
  local_68.shared_alloc_.direct_ptr = local_e8.shared_alloc_.direct_ptr;
  if ((((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
       local_e8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + -1;
    local_68.shared_alloc_.alloc = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_e8.shared_alloc_.alloc = (Alloc *)0x0;
  local_e8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this_00,&local_68);
  pAVar8 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar8);
      operator_delete(pAVar8,0x48);
    }
  }
  measure_ents_real_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_a8);
  pAVar8 = local_e8.shared_alloc_.alloc;
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  uVar4 = local_58._0_8_;
  if ((local_58._0_8_ & 7) == 0 && (Alloc *)local_58._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_58._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_58._0_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  uVar4 = local_d8._16_8_;
  if ((local_d8._16_8_ & 7) == 0 && (Alloc *)local_d8._16_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_d8._16_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_d8._16_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_e9);
  RVar11.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar11.write_.shared_alloc_.alloc = (Alloc *)this_00;
  return (Reals)RVar11.write_.shared_alloc_;
}

Assistant:

Reals measure_ents_real_tmpl(Mesh* mesh, LOs a2e, Reals coords) {
  OMEGA_H_TIME_FUNCTION;
  RealSimplexSizes measurer(coords);
  auto ev2v = mesh->ask_verts_of(edim);
  auto na = a2e.size();
  Write<Real> sizes(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<edim + 1>(ev2v, e);
    sizes[a] = measurer.measure<sdim, edim>(v);
  };
  parallel_for(na, f, "measure_ents_real");
  return sizes;
}